

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso2.c
# Opt level: O0

int Gia_Iso2ManCheckIsoPair
              (Gia_Man_t *p,Vec_Int_t *vVec0,Vec_Int_t *vVec1,Vec_Int_t *vMap0,Vec_Int_t *vMap1)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  Gia_Obj_t *pObj;
  Gia_Obj_t *pObj_00;
  Gia_Obj_t *pGVar4;
  int iObj1;
  int iObj0;
  int k;
  Gia_Obj_t *pObj1;
  Gia_Obj_t *pObj0;
  Vec_Int_t *vMap1_local;
  Vec_Int_t *vMap0_local;
  Vec_Int_t *vVec1_local;
  Vec_Int_t *vVec0_local;
  Gia_Man_t *p_local;
  
  iObj1 = 0;
  do {
    iVar2 = Vec_IntSize(vVec0);
    if (iVar2 <= iObj1) {
      return 1;
    }
    iVar2 = Vec_IntEntry(vVec0,iObj1);
    iVar3 = Vec_IntEntry(vVec1,iObj1);
    if (iVar2 != iVar3) {
      pObj = Gia_ManObj(p,iVar2);
      pObj_00 = Gia_ManObj(p,iVar3);
      if (pObj->Value != pObj_00->Value) {
        return 0;
      }
      if (pObj->Value != pObj_00->Value) {
        __assert_fail("pObj0->Value == pObj1->Value",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIso2.c"
                      ,0x1f5,
                      "int Gia_Iso2ManCheckIsoPair(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
      iVar2 = Gia_ObjIsAnd(pObj);
      if (iVar2 != 0) {
        pGVar4 = Gia_ObjFanin0(pObj);
        uVar1 = pGVar4->Value;
        pGVar4 = Gia_ObjFanin1(pObj);
        if (pGVar4->Value < uVar1) {
          pGVar4 = Gia_ObjFanin0(pObj_00);
          uVar1 = pGVar4->Value;
          pGVar4 = Gia_ObjFanin1(pObj_00);
          if (pGVar4->Value < uVar1) {
            iVar2 = Gia_ObjFaninC1(pObj);
            iVar3 = Gia_ObjFaninC1(pObj_00);
            if (iVar2 != iVar3) {
              return 0;
            }
            iVar2 = Gia_ObjFaninC0(pObj);
            iVar3 = Gia_ObjFaninC0(pObj_00);
            if (iVar2 != iVar3) {
              return 0;
            }
            iVar2 = Gia_ObjFaninId1p(p,pObj);
            iVar2 = Vec_IntEntry(vMap0,iVar2);
            iVar3 = Gia_ObjFaninId1p(p,pObj_00);
            iVar3 = Vec_IntEntry(vMap1,iVar3);
            if (iVar2 != iVar3) {
              return 0;
            }
            iVar2 = Gia_ObjFaninId0p(p,pObj);
            iVar2 = Vec_IntEntry(vMap0,iVar2);
            iVar3 = Gia_ObjFaninId0p(p,pObj_00);
            iVar3 = Vec_IntEntry(vMap1,iVar3);
            if (iVar2 != iVar3) {
              return 0;
            }
          }
          else {
            iVar2 = Gia_ObjFaninC1(pObj);
            iVar3 = Gia_ObjFaninC0(pObj_00);
            if (iVar2 != iVar3) {
              return 0;
            }
            iVar2 = Gia_ObjFaninC0(pObj);
            iVar3 = Gia_ObjFaninC1(pObj_00);
            if (iVar2 != iVar3) {
              return 0;
            }
            iVar2 = Gia_ObjFaninId1p(p,pObj);
            iVar2 = Vec_IntEntry(vMap0,iVar2);
            iVar3 = Gia_ObjFaninId0p(p,pObj_00);
            iVar3 = Vec_IntEntry(vMap1,iVar3);
            if (iVar2 != iVar3) {
              return 0;
            }
            iVar2 = Gia_ObjFaninId0p(p,pObj);
            iVar2 = Vec_IntEntry(vMap0,iVar2);
            iVar3 = Gia_ObjFaninId1p(p,pObj_00);
            iVar3 = Vec_IntEntry(vMap1,iVar3);
            if (iVar2 != iVar3) {
              return 0;
            }
          }
        }
        else {
          pGVar4 = Gia_ObjFanin0(pObj_00);
          uVar1 = pGVar4->Value;
          pGVar4 = Gia_ObjFanin1(pObj_00);
          if (pGVar4->Value < uVar1) {
            iVar2 = Gia_ObjFaninC0(pObj);
            iVar3 = Gia_ObjFaninC1(pObj_00);
            if (iVar2 != iVar3) {
              return 0;
            }
            iVar2 = Gia_ObjFaninC1(pObj);
            iVar3 = Gia_ObjFaninC0(pObj_00);
            if (iVar2 != iVar3) {
              return 0;
            }
            iVar2 = Gia_ObjFaninId0p(p,pObj);
            iVar2 = Vec_IntEntry(vMap0,iVar2);
            iVar3 = Gia_ObjFaninId1p(p,pObj_00);
            iVar3 = Vec_IntEntry(vMap1,iVar3);
            if (iVar2 != iVar3) {
              return 0;
            }
            iVar2 = Gia_ObjFaninId1p(p,pObj);
            iVar2 = Vec_IntEntry(vMap0,iVar2);
            iVar3 = Gia_ObjFaninId0p(p,pObj_00);
            iVar3 = Vec_IntEntry(vMap1,iVar3);
            if (iVar2 != iVar3) {
              return 0;
            }
          }
          else {
            iVar2 = Gia_ObjFaninC0(pObj);
            iVar3 = Gia_ObjFaninC0(pObj_00);
            if (iVar2 != iVar3) {
              return 0;
            }
            iVar2 = Gia_ObjFaninC1(pObj);
            iVar3 = Gia_ObjFaninC1(pObj_00);
            if (iVar2 != iVar3) {
              return 0;
            }
            iVar2 = Gia_ObjFaninId0p(p,pObj);
            iVar2 = Vec_IntEntry(vMap0,iVar2);
            iVar3 = Gia_ObjFaninId0p(p,pObj_00);
            iVar3 = Vec_IntEntry(vMap1,iVar3);
            if (iVar2 != iVar3) {
              return 0;
            }
            iVar2 = Gia_ObjFaninId1p(p,pObj);
            iVar2 = Vec_IntEntry(vMap0,iVar2);
            iVar3 = Gia_ObjFaninId1p(p,pObj_00);
            iVar3 = Vec_IntEntry(vMap1,iVar3);
            if (iVar2 != iVar3) {
              return 0;
            }
          }
        }
      }
    }
    iObj1 = iObj1 + 1;
  } while( true );
}

Assistant:

int Gia_Iso2ManCheckIsoPair( Gia_Man_t * p, Vec_Int_t * vVec0, Vec_Int_t * vVec1, Vec_Int_t * vMap0, Vec_Int_t * vMap1 )
{
    Gia_Obj_t * pObj0, * pObj1;
    int k, iObj0, iObj1;
    Vec_IntForEachEntryTwo( vVec0, vVec1, iObj0, iObj1, k )
    {
        if ( iObj0 == iObj1 )
            continue;
        pObj0 = Gia_ManObj(p, iObj0);
        pObj1 = Gia_ManObj(p, iObj1);
        if ( pObj0->Value != pObj1->Value )
            return 0;
        assert( pObj0->Value == pObj1->Value );
        if ( !Gia_ObjIsAnd(pObj0) )
            continue;
        if ( Gia_ObjFanin0(pObj0)->Value <= Gia_ObjFanin1(pObj0)->Value )
        {
            if ( Gia_ObjFanin0(pObj1)->Value <= Gia_ObjFanin1(pObj1)->Value )
            {
                if ( Gia_ObjFaninC0(pObj0) != Gia_ObjFaninC0(pObj1)  || Gia_ObjFaninC1(pObj0) != Gia_ObjFaninC1(pObj1)   ||
                     Vec_IntEntry(vMap0, Gia_ObjFaninId0p(p, pObj0)) != Vec_IntEntry( vMap1, Gia_ObjFaninId0p(p, pObj1)) || 
                     Vec_IntEntry(vMap0, Gia_ObjFaninId1p(p, pObj0)) != Vec_IntEntry( vMap1, Gia_ObjFaninId1p(p, pObj1)) )
                     return 0;
            }
            else
            {
                if ( Gia_ObjFaninC0(pObj0) != Gia_ObjFaninC1(pObj1)  || Gia_ObjFaninC1(pObj0) != Gia_ObjFaninC0(pObj1)   ||
                     Vec_IntEntry(vMap0, Gia_ObjFaninId0p(p, pObj0)) != Vec_IntEntry( vMap1, Gia_ObjFaninId1p(p, pObj1)) || 
                     Vec_IntEntry(vMap0, Gia_ObjFaninId1p(p, pObj0)) != Vec_IntEntry( vMap1, Gia_ObjFaninId0p(p, pObj1)) )
                     return 0;
            }
        }
        else
        {
            if ( Gia_ObjFanin0(pObj1)->Value <= Gia_ObjFanin1(pObj1)->Value )
            {
                if ( Gia_ObjFaninC1(pObj0) != Gia_ObjFaninC0(pObj1)  || Gia_ObjFaninC0(pObj0) != Gia_ObjFaninC1(pObj1)   ||
                     Vec_IntEntry(vMap0, Gia_ObjFaninId1p(p, pObj0)) != Vec_IntEntry( vMap1, Gia_ObjFaninId0p(p, pObj1)) || 
                     Vec_IntEntry(vMap0, Gia_ObjFaninId0p(p, pObj0)) != Vec_IntEntry( vMap1, Gia_ObjFaninId1p(p, pObj1)) )
                     return 0;
            }
            else
            {
                if ( Gia_ObjFaninC1(pObj0) != Gia_ObjFaninC1(pObj1)  || Gia_ObjFaninC0(pObj0) != Gia_ObjFaninC0(pObj1)   ||
                     Vec_IntEntry(vMap0, Gia_ObjFaninId1p(p, pObj0)) != Vec_IntEntry( vMap1, Gia_ObjFaninId1p(p, pObj1)) || 
                     Vec_IntEntry(vMap0, Gia_ObjFaninId0p(p, pObj0)) != Vec_IntEntry( vMap1, Gia_ObjFaninId0p(p, pObj1)) )
                     return 0;
            }
        }
    }
    return 1;
}